

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::DecimalMatcher::DecimalMatcher
          (DecimalMatcher *this,DecimalFormatSymbols *symbols,Grouper *grouper,
          parse_flags_t parseFlags)

{
  UBool UVar1;
  int16_t iVar2;
  Key KVar3;
  UChar32 UVar4;
  int32_t iVar5;
  UnicodeString *pUVar6;
  UnicodeSet *pUVar7;
  undefined8 *puVar8;
  UnicodeString *local_1b8;
  UnicodeString *local_1a8;
  UnicodeSet *local_188;
  UnicodeSet *local_158;
  int local_e0;
  int32_t i;
  UnicodeString *digitStrings;
  UChar32 cpZero;
  UnicodeSet *set_1;
  UnicodeSet *set;
  Key local_40;
  Key local_3c;
  Key decimalKey;
  Key groupingKey;
  bool strictSeparators;
  uint local_24;
  Grouper *pGStack_20;
  parse_flags_t parseFlags_local;
  Grouper *grouper_local;
  DecimalFormatSymbols *symbols_local;
  DecimalMatcher *this_local;
  
  local_24 = parseFlags;
  pGStack_20 = grouper;
  grouper_local = (Grouper *)symbols;
  symbols_local = (DecimalFormatSymbols *)this;
  NumberParseMatcher::NumberParseMatcher(&this->super_NumberParseMatcher);
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__DecimalMatcher_004b0548;
  UnicodeString::UnicodeString(&this->groupingSeparator);
  UnicodeString::UnicodeString(&this->decimalSeparator);
  LocalPointer<const_icu_63::UnicodeSet>::LocalPointer(&this->fLocalDecimalUniSet,(UnicodeSet *)0x0)
  ;
  LocalPointer<const_icu_63::UnicodeSet>::LocalPointer(&this->fLocalSeparatorSet,(UnicodeSet *)0x0);
  LocalArray<const_icu_63::UnicodeString>::LocalArray
            (&this->fLocalDigitStrings,(UnicodeString *)0x0);
  if ((local_24 & 2) == 0) {
    pUVar6 = DecimalFormatSymbols::getConstSymbol
                       ((DecimalFormatSymbols *)grouper_local,kGroupingSeparatorSymbol);
    UnicodeString::operator=(&this->groupingSeparator,pUVar6);
    pUVar6 = DecimalFormatSymbols::getConstSymbol
                       ((DecimalFormatSymbols *)grouper_local,kDecimalSeparatorSymbol);
    UnicodeString::operator=(&this->decimalSeparator,pUVar6);
  }
  else {
    pUVar6 = DecimalFormatSymbols::getConstSymbol
                       ((DecimalFormatSymbols *)grouper_local,kMonetaryGroupingSeparatorSymbol);
    UnicodeString::operator=(&this->groupingSeparator,pUVar6);
    pUVar6 = DecimalFormatSymbols::getConstSymbol
                       ((DecimalFormatSymbols *)grouper_local,kMonetarySeparatorSymbol);
    UnicodeString::operator=(&this->decimalSeparator,pUVar6);
  }
  local_3c = (local_24 & 4) >> 2;
  decimalKey._3_1_ = (undefined1)local_3c;
  local_3c = local_3c | ALL_SEPARATORS;
  pUVar7 = unisets::get(local_3c);
  this->groupingUniSet = pUVar7;
  UnicodeString::UnicodeString((UnicodeString *)&set,&this->decimalSeparator);
  KVar3 = ((byte)decimalKey._3_1_ & 1) * 2 + COMMA;
  local_188 = (UnicodeSet *)(ulong)(uint)KVar3;
  KVar3 = unisets::chooseFrom((UnicodeString *)&set,KVar3,((byte)decimalKey._3_1_ & 1) * 2 + PERIOD)
  ;
  UnicodeString::~UnicodeString((UnicodeString *)&set);
  local_40 = KVar3;
  if (KVar3 < EMPTY) {
    UVar1 = UnicodeString::isEmpty(&this->decimalSeparator);
    if (UVar1 == '\0') {
      pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)local_188);
      local_158 = (UnicodeSet *)0x0;
      if (pUVar7 != (UnicodeSet *)0x0) {
        UnicodeSet::UnicodeSet(pUVar7);
        local_158 = pUVar7;
      }
      UVar4 = UnicodeString::char32At(&this->decimalSeparator,0);
      UnicodeSet::add(local_158,UVar4);
      UnicodeSet::freeze(local_158);
      this->decimalUniSet = local_158;
      LocalPointer<const_icu_63::UnicodeSet>::adoptInstead(&this->fLocalDecimalUniSet,local_158);
      local_188 = local_158;
    }
    else {
      pUVar7 = unisets::get(EMPTY);
      this->decimalUniSet = pUVar7;
    }
  }
  else {
    pUVar7 = unisets::get(KVar3);
    this->decimalUniSet = pUVar7;
  }
  if ((local_3c < EMPTY) || (local_40 < EMPTY)) {
    pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)local_188);
    local_188 = (UnicodeSet *)0x0;
    if (pUVar7 != (UnicodeSet *)0x0) {
      UnicodeSet::UnicodeSet(pUVar7);
      local_188 = pUVar7;
    }
    UnicodeSet::addAll(local_188,this->groupingUniSet);
    UnicodeSet::addAll(local_188,this->decimalUniSet);
    UnicodeSet::freeze(local_188);
    this->separatorSet = local_188;
    LocalPointer<const_icu_63::UnicodeSet>::adoptInstead(&this->fLocalSeparatorSet,local_188);
    this->leadSet = (UnicodeSet *)0x0;
  }
  else {
    this->separatorSet = this->groupingUniSet;
    pUVar7 = unisets::get((uint)(byte)decimalKey._3_1_ & DEFAULT_IGNORABLES ^
                          DIGITS_OR_STRICT_ALL_SEPARATORS);
    this->leadSet = pUVar7;
  }
  UVar4 = DecimalFormatSymbols::getCodePointZero((DecimalFormatSymbols *)grouper_local);
  if ((UVar4 != -1) && (UVar1 = u_isdigit_63(UVar4), UVar1 != '\0')) {
    local_188 = (UnicodeSet *)0xa;
    iVar5 = u_digit_63(UVar4,'\n');
    if (iVar5 == 0) goto LAB_00320182;
  }
  puVar8 = (undefined8 *)UMemory::operator_new__((UMemory *)0x288,(size_t)local_188);
  local_1a8 = (UnicodeString *)0x0;
  if (puVar8 != (undefined8 *)0x0) {
    *puVar8 = 10;
    local_1a8 = (UnicodeString *)(puVar8 + 1);
    local_1b8 = local_1a8;
    do {
      UnicodeString::UnicodeString(local_1b8);
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != (UnicodeString *)(puVar8 + 0x51));
  }
  LocalArray<const_icu_63::UnicodeString>::adoptInstead(&this->fLocalDigitStrings,local_1a8);
  for (local_e0 = 0; local_e0 < 10; local_e0 = local_e0 + 1) {
    pUVar6 = DecimalFormatSymbols::getConstDigitSymbol
                       ((DecimalFormatSymbols *)grouper_local,local_e0);
    UnicodeString::operator=(local_1a8 + local_e0,pUVar6);
  }
LAB_00320182:
  this->requireGroupingMatch = SUB41((local_24 & 8) >> 3,0);
  this->groupingDisabled = SUB41((local_24 & 0x20) >> 5,0);
  this->integerOnly = SUB41((local_24 & 0x10) >> 4,0);
  iVar2 = icu_63::number::impl::Grouper::getPrimary(pGStack_20);
  this->grouping1 = iVar2;
  iVar2 = icu_63::number::impl::Grouper::getSecondary(pGStack_20);
  this->grouping2 = iVar2;
  return;
}

Assistant:

DecimalMatcher::DecimalMatcher(const DecimalFormatSymbols& symbols, const Grouper& grouper,
                               parse_flags_t parseFlags) {
    if (0 != (parseFlags & PARSE_FLAG_MONETARY_SEPARATORS)) {
        groupingSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kMonetaryGroupingSeparatorSymbol);
        decimalSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kMonetarySeparatorSymbol);
    } else {
        groupingSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
        decimalSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
    }
    bool strictSeparators = 0 != (parseFlags & PARSE_FLAG_STRICT_SEPARATORS);
    unisets::Key groupingKey = strictSeparators ? unisets::STRICT_ALL_SEPARATORS
                                                : unisets::ALL_SEPARATORS;

    // Attempt to find separators in the static cache

    groupingUniSet = unisets::get(groupingKey);
    unisets::Key decimalKey = unisets::chooseFrom(
            decimalSeparator,
            strictSeparators ? unisets::STRICT_COMMA : unisets::COMMA,
            strictSeparators ? unisets::STRICT_PERIOD : unisets::PERIOD);
    if (decimalKey >= 0) {
        decimalUniSet = unisets::get(decimalKey);
    } else if (!decimalSeparator.isEmpty()) {
        auto* set = new UnicodeSet();
        set->add(decimalSeparator.char32At(0));
        set->freeze();
        decimalUniSet = set;
        fLocalDecimalUniSet.adoptInstead(set);
    } else {
        decimalUniSet = unisets::get(unisets::EMPTY);
    }

    if (groupingKey >= 0 && decimalKey >= 0) {
        // Everything is available in the static cache
        separatorSet = groupingUniSet;
        leadSet = unisets::get(
                strictSeparators ? unisets::DIGITS_OR_ALL_SEPARATORS
                                 : unisets::DIGITS_OR_STRICT_ALL_SEPARATORS);
    } else {
        auto* set = new UnicodeSet();
        set->addAll(*groupingUniSet);
        set->addAll(*decimalUniSet);
        set->freeze();
        separatorSet = set;
        fLocalSeparatorSet.adoptInstead(set);
        leadSet = nullptr;
    }

    UChar32 cpZero = symbols.getCodePointZero();
    if (cpZero == -1 || !u_isdigit(cpZero) || u_digit(cpZero, 10) != 0) {
        // Uncommon case: okay to allocate.
        auto digitStrings = new UnicodeString[10];
        fLocalDigitStrings.adoptInstead(digitStrings);
        for (int32_t i = 0; i <= 9; i++) {
            digitStrings[i] = symbols.getConstDigitSymbol(i);
        }
    }

    requireGroupingMatch = 0 != (parseFlags & PARSE_FLAG_STRICT_GROUPING_SIZE);
    groupingDisabled = 0 != (parseFlags & PARSE_FLAG_GROUPING_DISABLED);
    integerOnly = 0 != (parseFlags & PARSE_FLAG_INTEGER_ONLY);
    grouping1 = grouper.getPrimary();
    grouping2 = grouper.getSecondary();

    // Fraction grouping parsing is disabled for now but could be enabled later.
    // See http://bugs.icu-project.org/trac/ticket/10794
    // fractionGrouping = 0 != (parseFlags & PARSE_FLAG_FRACTION_GROUPING_ENABLED);
}